

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void print_props(mg_connection *nc,char *name,cs_stat_t *stp)

{
  tm *__tp;
  size_t s_len;
  char *pcVar1;
  time_t t;
  char mtime [64];
  char buf [1500];
  __time_t local_650;
  char local_648 [64];
  char local_608 [1504];
  
  local_650 = stp->st_mtime;
  __tp = gmtime(&local_650);
  strftime(local_648,0x40,"%a, %d %b %Y %H:%M:%S GMT",__tp);
  s_len = strlen(name);
  mg_url_encode(name,s_len,local_608,(size_t)__tp);
  pcVar1 = "";
  if ((stp->st_mode & 0xf000) == 0x4000) {
    pcVar1 = "<d:collection/>";
  }
  mg_printf(nc,
            "<d:response><d:href>%s</d:href><d:propstat><d:prop><d:resourcetype>%s</d:resourcetype><d:getcontentlength>%ld</d:getcontentlength><d:getlastmodified>%s</d:getlastmodified></d:prop><d:status>HTTP/1.1 200 OK</d:status></d:propstat></d:response>\n"
            ,local_608,pcVar1,stp->st_size,local_648);
  return;
}

Assistant:

static void print_props(struct mg_connection *nc, const char *name,
                        cs_stat_t *stp) {
    char mtime[64], buf[MAX_PATH_SIZE * 3];
    time_t t = stp->st_mtime; /* store in local variable for NDK compile */
    gmt_time_string(mtime, sizeof(mtime), &t);
    mg_url_encode(name, strlen(name), buf, sizeof(buf));
    mg_printf(nc,
              "<d:response>"
                      "<d:href>%s</d:href>"
                      "<d:propstat>"
                      "<d:prop>"
                      "<d:resourcetype>%s</d:resourcetype>"
                      "<d:getcontentlength>%" INT64_FMT
                      "</d:getcontentlength>"
                      "<d:getlastmodified>%s</d:getlastmodified>"
                      "</d:prop>"
                      "<d:status>HTTP/1.1 200 OK</d:status>"
                      "</d:propstat>"
                      "</d:response>\n",
              buf, S_ISDIR(stp->st_mode) ? "<d:collection/>" : "",
              (int64_t) stp->st_size, mtime);
}